

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

Fact * __thiscall
r_exec::HLPBindingMap::build_f_ihlp(HLPBindingMap *this,Code *hlp,uint16_t opcode,bool wr_enabled)

{
  int iVar1;
  _Mem *p_Var2;
  Code *pCVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_reference pvVar4;
  Value *pVVar5;
  undefined4 extraout_var_02;
  size_type sVar6;
  undefined4 extraout_var_03;
  ulong uVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Fact *this_00;
  Atom *s;
  Fact *f_ihlp;
  Atom local_68 [6];
  ushort local_62;
  Atom local_60 [4];
  short local_5c;
  uint16_t i_1;
  Atom local_58 [4];
  uint16_t exposed_arg_count;
  uint16_t exposed_arg_start;
  ushort local_50;
  ushort local_4e;
  Atom local_4c [2];
  uint16_t i;
  uint16_t extent_index;
  uint16_t write_index;
  ushort local_42;
  Atom local_40 [6];
  uint16_t tpl_arg_index;
  Atom local_2c [4];
  Code *local_28;
  Code *ihlp;
  bool wr_enabled_local;
  Code *pCStack_18;
  uint16_t opcode_local;
  Code *hlp_local;
  HLPBindingMap *this_local;
  
  ihlp._5_1_ = wr_enabled;
  ihlp._6_2_ = opcode;
  pCStack_18 = hlp;
  hlp_local = (Code *)this;
  p_Var2 = _Mem::Get();
  r_code::Atom::Object((ushort)local_2c,(uchar)ihlp._6_2_);
  pCVar3 = (Code *)(**(code **)(*(long *)p_Var2 + 0x50))(p_Var2,local_2c);
  r_code::Atom::~Atom(local_2c);
  local_28 = pCVar3;
  r_code::Atom::RPointer((ushort)local_40);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_40);
  r_code::Atom::~Atom(local_40);
  (*(local_28->super__Object)._vptr__Object[0x19])(local_28,pCStack_18);
  local_42 = 6;
  r_code::Atom::IPointer((ushort)&extent_index);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),(Atom *)&extent_index);
  r_code::Atom::~Atom((Atom *)&extent_index);
  r_code::Atom::Set((uchar)local_4c);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,(ulong)local_42);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_4c);
  r_code::Atom::~Atom(local_4c);
  local_4e = local_42 + 1;
  local_50 = local_4e + (this->super_BindingMap).first_index;
  for (exposed_arg_start = 0; exposed_arg_start < (this->super_BindingMap).first_index;
      exposed_arg_start = exposed_arg_start + 1) {
    pvVar4 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
             operator[](&(this->super_BindingMap).map,(ulong)exposed_arg_start);
    pVVar5 = core::P<r_exec::Value>::operator->(pvVar4);
    (*(pVVar5->super__Object)._vptr__Object[3])(pVVar5,local_28,(ulong)local_4e,&local_50);
    local_4e = local_4e + 1;
  }
  r_code::Atom::IPointer((ushort)local_58);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_58);
  r_code::Atom::~Atom(local_58);
  i_1 = (this->super_BindingMap).first_index;
  sVar6 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                    (&(this->super_BindingMap).map);
  local_5c = ((short)sVar6 - i_1) + -2;
  r_code::Atom::Set((uchar)local_60);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,(ulong)local_50);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_60);
  r_code::Atom::~Atom(local_60);
  local_4e = local_50 + 1;
  local_50 = local_4e + local_5c;
  for (local_62 = i_1; uVar7 = (ulong)local_62,
      sVar6 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                        (&(this->super_BindingMap).map), uVar7 < sVar6; local_62 = local_62 + 1) {
    if (((uint)local_62 != (int)(this->super_BindingMap).fwd_after_index) &&
       ((uint)local_62 != (int)(this->super_BindingMap).fwd_before_index)) {
      pvVar4 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
               operator[](&(this->super_BindingMap).map,(ulong)local_62);
      pVVar5 = core::P<r_exec::Value>::operator->(pvVar4);
      (*(pVVar5->super__Object)._vptr__Object[3])(pVVar5,local_28,(ulong)local_4e,&local_50);
      local_4e = local_4e + 1;
    }
  }
  r_code::Atom::Boolean(SUB81(local_68,0));
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_68);
  r_code::Atom::~Atom(local_68);
  r_code::Atom::Float(1.0);
  iVar1 = (*(local_28->super__Object)._vptr__Object[4])(local_28,5);
  s = (Atom *)((long)&f_ihlp + 4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),s);
  r_code::Atom::~Atom((Atom *)((long)&f_ihlp + 4));
  this_00 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact(this_00,local_28,0,0,1.0,1.0);
  local_50 = 6;
  pvVar4 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::operator[]
                     (&(this->super_BindingMap).map,(long)(this->super_BindingMap).fwd_after_index);
  pVVar5 = core::P<r_exec::Value>::operator->(pvVar4);
  (*(pVVar5->super__Object)._vptr__Object[3])(pVVar5,this_00,2,&local_50);
  pvVar4 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::operator[]
                     (&(this->super_BindingMap).map,(long)(this->super_BindingMap).fwd_before_index)
  ;
  pVVar5 = core::P<r_exec::Value>::operator->(pvVar4);
  (*(pVVar5->super__Object)._vptr__Object[3])(pVVar5,this_00,3,&local_50);
  return this_00;
}

Assistant:

Fact *HLPBindingMap::build_f_ihlp(Code *hlp, uint16_t opcode, bool wr_enabled) const
{
    Code *ihlp = _Mem::Get()->build_object(Atom::Object(opcode, I_HLP_ARITY));
    ihlp->code(I_HLP_OBJ) = Atom::RPointer(0);
    ihlp->add_reference(hlp);
    uint16_t tpl_arg_index = I_HLP_ARITY + 1;
    ihlp->code(I_HLP_TPL_ARGS) = Atom::IPointer(tpl_arg_index);
    ihlp->code(tpl_arg_index) = Atom::Set(first_index);
    uint16_t write_index = tpl_arg_index + 1;
    uint16_t extent_index = write_index + first_index;

    for (uint16_t i = 0; i < first_index; ++i) { // valuate tpl args.
        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_ARGS) = Atom::IPointer(extent_index);
    uint16_t exposed_arg_start = first_index;
    uint16_t exposed_arg_count = map.size() - exposed_arg_start - 2; // -2: do not expose the first after/before timestamps.
    ihlp->code(extent_index) = Atom::Set(exposed_arg_count);
    write_index = extent_index + 1;
    extent_index = write_index + exposed_arg_count;

    for (uint16_t i = exposed_arg_start; i < map.size(); ++i) { // valuate args.
        if (i == fwd_after_index) {
            continue;
        }

        if (i == fwd_before_index) {
            continue;
        }

        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_WR_E) = Atom::Boolean(wr_enabled);
    ihlp->code(I_HLP_ARITY) = Atom::Float(1); // psln_thr.
    Fact *f_ihlp = new Fact(ihlp, 0, 0, 1, 1);
    extent_index = FACT_ARITY + 1;
    map[fwd_after_index]->valuate(f_ihlp, FACT_AFTER, extent_index);
    map[fwd_before_index]->valuate(f_ihlp, FACT_BEFORE, extent_index);
    return f_ihlp;
}